

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O0

FT_Error tt_get_kerning(FT_Face ttface,FT_UInt left_glyph,FT_UInt right_glyph,FT_Vector *kerning)

{
  long lVar1;
  int iVar2;
  SFNT_Service sfnt;
  TT_Face face;
  FT_Vector *kerning_local;
  FT_UInt right_glyph_local;
  FT_UInt left_glyph_local;
  FT_Face ttface_local;
  
  lVar1 = *(long *)&ttface[3].units_per_EM;
  kerning->x = 0;
  kerning->y = 0;
  if (lVar1 != 0) {
    iVar2 = (**(code **)(lVar1 + 0xa8))(ttface,left_glyph,right_glyph);
    kerning->x = (long)iVar2;
  }
  return 0;
}

Assistant:

static FT_Error
  tt_get_kerning( FT_Face     ttface,          /* TT_Face */
                  FT_UInt     left_glyph,
                  FT_UInt     right_glyph,
                  FT_Vector*  kerning )
  {
    TT_Face       face = (TT_Face)ttface;
    SFNT_Service  sfnt = (SFNT_Service)face->sfnt;


    kerning->x = 0;
    kerning->y = 0;

    if ( sfnt )
      kerning->x = sfnt->get_kerning( face, left_glyph, right_glyph );

    return 0;
  }